

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void kratos::decouple_generator_ports(Generator *top)

{
  undefined1 local_108 [8];
  GeneratorStmtCacheVisitor v_1;
  GeneratorPortVisitor visitor;
  undefined1 local_60 [8];
  GeneratorStmtCacheVisitor v;
  Generator *top_local;
  
  v._72_8_ = top;
  GeneratorStmtCacheVisitor::GeneratorStmtCacheVisitor((GeneratorStmtCacheVisitor *)local_60,true);
  IRVisitor::visit_generator_root((IRVisitor *)local_60,(Generator *)v._72_8_);
  GeneratorStmtCacheVisitor::~GeneratorStmtCacheVisitor((GeneratorStmtCacheVisitor *)local_60);
  GeneratorPortVisitor::GeneratorPortVisitor((GeneratorPortVisitor *)&v_1.value_);
  IRVisitor::visit_generator_root((IRVisitor *)&v_1.value_,(Generator *)v._72_8_);
  GeneratorStmtCacheVisitor::GeneratorStmtCacheVisitor((GeneratorStmtCacheVisitor *)local_108,false)
  ;
  IRVisitor::visit_generator_root((IRVisitor *)local_108,(Generator *)v._72_8_);
  GeneratorStmtCacheVisitor::~GeneratorStmtCacheVisitor((GeneratorStmtCacheVisitor *)local_108);
  GeneratorPortVisitor::~GeneratorPortVisitor((GeneratorPortVisitor *)&v_1.value_);
  return;
}

Assistant:

void decouple_generator_ports(Generator* top) {
    {
        GeneratorStmtCacheVisitor v(true);
        v.visit_generator_root(top);
    }
    GeneratorPortVisitor visitor;
    visitor.visit_generator_root(top);
    {
        GeneratorStmtCacheVisitor v(false);
        v.visit_generator_root(top);
    }
}